

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

bool __thiscall
dg::dda::MemorySSATransformation::callMayDefineTarget
          (MemorySSATransformation *this,RWNodeCall *C,RWNode *target)

{
  bool bVar1;
  SubgraphInfo *this_00;
  MemorySSATransformation *in_RDX;
  RWNodeCall *in_RSI;
  RWNode *in_RDI;
  SubgraphInfo *si;
  RWNode *cv;
  RWSubgraph *subg;
  RWCalledValue *callee;
  iterator __end2;
  iterator __begin2;
  CalleesT *__range2;
  RWNode *in_stack_ffffffffffffff88;
  MemorySSATransformation *in_stack_ffffffffffffff90;
  Offset local_58;
  RWNode *local_50;
  RWSubgraph *local_48;
  RWCalledValue *local_40;
  RWCalledValue *local_38;
  __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
  local_30;
  CalleesT *local_28;
  MemorySSATransformation *local_20;
  
  local_20 = in_RDX;
  local_28 = RWNodeCall::getCallees(in_RSI);
  local_30._M_current =
       (RWCalledValue *)
       std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::begin
                 ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *)
                  in_stack_ffffffffffffff88);
  local_38 = (RWCalledValue *)
             std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::end
                       ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *)
                        in_stack_ffffffffffffff88);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      return false;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
               ::operator*(&local_30);
    local_48 = RWCalledValue::getSubgraph(local_40);
    if (local_48 == (RWSubgraph *)0x0) {
      in_stack_ffffffffffffff88 = RWCalledValue::getCalledValue(local_40);
      in_stack_ffffffffffffff90 = local_20;
      local_50 = in_stack_ffffffffffffff88;
      Offset::Offset(&local_58,Offset::UNKNOWN);
      bVar1 = RWNode::defines((RWNode *)__begin2._M_current,(RWNode *)__end2._M_current,
                              (Offset *)callee);
      if (bVar1) {
        return true;
      }
    }
    else {
      this_00 = getSubgraphInfo(in_stack_ffffffffffffff90,(RWSubgraph *)in_stack_ffffffffffffff88);
      computeModRef((MemorySSATransformation *)__range2,(RWSubgraph *)__begin2._M_current,
                    (SubgraphInfo *)__end2._M_current);
      bVar1 = ModRefInfo::mayDefineOrUnknown((ModRefInfo *)this_00,in_RDI);
      if (bVar1) {
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

bool MemorySSATransformation::callMayDefineTarget(RWNodeCall *C,
                                                  RWNode *target) {
    // check if this call may define the memory at all
    for (auto &callee : C->getCallees()) {
        auto *subg = callee.getSubgraph();
        if (!subg) {
            auto *cv = callee.getCalledValue();
            if (cv->defines(target)) {
                return true;
            }
        } else {
            auto &si = getSubgraphInfo(subg);
            computeModRef(subg, si);
            assert(si.modref.isInitialized());
            if (si.modref.mayDefineOrUnknown(target)) {
                return true;
            }
        }
    }

    return false;
}